

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int verify_opts(nt_opts *opts,char *prog)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int errs;
  int ac;
  char *prog_local;
  nt_opts *opts_local;
  
  cVar9 = false;
  bVar2 = true;
  if (opts->check_hdr == 0) {
    bVar2 = opts->check_nim != 0;
  }
  bVar3 = true;
  if (opts->diff_hdr == 0) {
    bVar3 = opts->diff_nim != 0;
  }
  bVar4 = true;
  if (((opts->disp_hdr == 0) && (bVar4 = true, opts->disp_nim == 0)) &&
     (bVar4 = true, opts->disp_ana == 0)) {
    bVar4 = opts->disp_exts != 0;
  }
  bVar5 = true;
  if (opts->mod_hdr == 0) {
    bVar5 = opts->mod_nim != 0;
  }
  bVar6 = true;
  if ((opts->swap_hdr == 0) && (bVar6 = true, opts->swap_ana == 0)) {
    bVar6 = opts->swap_old != 0;
  }
  bVar7 = true;
  if (opts->add_exts == 0) {
    bVar7 = opts->rm_exts != 0;
  }
  bVar8 = true;
  if (opts->dts == 0) {
    bVar8 = opts->dci != 0;
  }
  uVar1 = (uint)bVar8 +
          (uint)(opts->cci != 0) +
          (uint)(opts->cbl != 0) +
          (uint)(opts->strip != 0) +
          (uint)bVar7 + (uint)bVar6 + (uint)bVar5 + (uint)bVar4 + (uint)bVar3 + (uint)bVar2;
  if (uVar1 == 0) {
    fprintf(_stderr,
            "** no action option, so nothing to do...\n   (try one of \'-add...\', \'-diff...\', \'-disp...\' or \'-mod...\')\n   (see \'%s -help\' for details)\n"
            ,prog);
    opts_local._4_4_ = 1;
  }
  else if (uVar1 < 2) {
    if ((opts->mod_hdr == 0) || (opts->mod_nim == 0)) {
      if ((opts->add_exts == 0) || (opts->rm_exts == 0)) {
        if (((opts->add_exts == 0) && (opts->rm_exts == 0)) || (0 < (opts->elist).len)) {
          if ((opts->mod_hdr != 0) || (opts->mod_nim != 0)) {
            if ((opts->flist).len < 1) {
              fprintf(_stderr,"** missing field to modify (need \'-mod_field\' opt)\n");
              return 1;
            }
            if ((opts->flist).len != (opts->vlist).len) {
              fprintf(_stderr,"** error: modifying %d fields with %d values\n",
                      (ulong)(uint)(opts->flist).len,(ulong)(uint)(opts->vlist).len);
              return 1;
            }
          }
          if ((opts->diff_hdr == 0) && (opts->diff_nim == 0)) {
            if ((((((0 < (opts->elist).len) || (opts->mod_hdr != 0)) || (opts->mod_nim != 0)) ||
                 ((opts->swap_hdr != 0 || (opts->swap_ana != 0)))) || (opts->swap_old != 0)) &&
               (opts->overwrite == 0)) {
              if ((opts->infiles).len < 2) {
                cVar9 = opts->prefix == (char *)0x0;
                if ((bool)cVar9) {
                  fprintf(_stderr,"** missing -prefix for output file\n");
                }
              }
              else {
                fprintf(_stderr,
                        "** without -overwrite, only one input file may be modified at a time\n");
                cVar9 = true;
              }
            }
          }
          else if ((opts->infiles).len != 2) {
            fprintf(_stderr,"** \'-diff_XXX\' options require exactly 2 inputs files\n");
            return 1;
          }
          if (((opts->dci_lines != 0) && (opts->dts == 0)) && (opts->dci == 0)) {
            fprintf(_stderr,"** option \'-dci_lines\' must only be used with \'-dts\'\n");
            cVar9 = cVar9 + '\x01';
          }
          if ((opts->infiles).len < 1) {
            fprintf(_stderr,"** missing input files (see -infiles option)\n");
            cVar9 = cVar9 + '\x01';
          }
          if ((opts->overwrite != 0) && (opts->prefix != (char *)0x0)) {
            fprintf(_stderr,"** please specify only one of -prefix and -overwrite\n");
            cVar9 = cVar9 + '\x01';
          }
          if (cVar9 == '\0') {
            if (1 < g_debug) {
              fprintf(_stderr,"+d options seem valid\n");
            }
            opts_local._4_4_ = 0;
          }
          else {
            opts_local._4_4_ = 1;
          }
        }
        else {
          fprintf(_stderr,"** missing extensions to add or remove\n");
          opts_local._4_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"** cannot use both \'-add_*_ext\' and \'-rm_ext\'\n");
        opts_local._4_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"** cannot use both \'-mod_hdr\' and \'-mod_nim\'\n");
      opts_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,
            "** only one action option is allowed, please use only one of:\n        \'-add_...\', \'-check_...\', \'-diff_...\', \'-disp_...\',\n        \'-mod_...\', \'-strip\', \'-dts\', \'-cbl\' or \'-cci\'\n   (see \'%s -help\' for details)\n"
            ,prog);
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int verify_opts( nt_opts * opts, char * prog )
{
   int ac, errs = 0;   /* number of requested action types */

   /* check that only one of disp, diff, mod or add_*_ext is used */
   ac  = (opts->check_hdr || opts->check_nim                   ) ? 1 : 0;
   ac += (opts->diff_hdr  || opts->diff_nim                    ) ? 1 : 0;
   ac += (opts->disp_hdr  || opts->disp_nim  ||
          opts->disp_ana  || opts->disp_exts                   ) ? 1 : 0;
   ac += (opts->mod_hdr   || opts->mod_nim                     ) ? 1 : 0;
   ac += (opts->swap_hdr  || opts->swap_ana  || opts->swap_old ) ? 1 : 0;
   ac += (opts->add_exts  || opts->rm_exts                     ) ? 1 : 0;
   ac += (opts->strip                                          ) ? 1 : 0;
   ac += (opts->cbl                                            ) ? 1 : 0;
   ac += (opts->cci                                            ) ? 1 : 0;
   ac += (opts->dts       || opts->dci                         ) ? 1 : 0;

   if( ac < 1 )
   {
      fprintf(stderr,
              "** no action option, so nothing to do...\n"
              "   (try one of '-add...', '-diff...', '-disp...' or '-mod...')\n"
              "   (see '%s -help' for details)\n", prog);
      return 1;
   }
   else if( ac > 1 )
   {
      fprintf(stderr,
         "** only one action option is allowed, please use only one of:\n"
         "        '-add_...', '-check_...', '-diff_...', '-disp_...',\n"
         "        '-mod_...', '-strip', '-dts', '-cbl' or '-cci'\n"
         "   (see '%s -help' for details)\n", prog);
      return 1;
   }

   /* can modify nifti_1_header or nifti_image, but not both */
   if( opts->mod_hdr && opts->mod_nim )
   {
      fprintf(stderr,"** cannot use both '-mod_hdr' and '-mod_nim'\n");
      return 1;
   }

   /* can add or remove extensions, but not both */
   if( opts->add_exts && opts->rm_exts )
   {
      fprintf(stderr,"** cannot use both '-add_*_ext' and '-rm_ext'\n");
      return 1;
   }
   if( (opts->add_exts || opts->rm_exts) && opts->elist.len <= 0 )
   {
      fprintf(stderr,"** missing extensions to add or remove\n");
      return 1;
   }

   /* if modify, then we need fields and corresponding values */
   if( opts->mod_hdr || opts->mod_nim )
   {
      if( opts->flist.len <= 0 )
      {
         fprintf(stderr,"** missing field to modify (need '-mod_field' opt)\n");
         return 1;
      }
      if( opts->flist.len != opts->vlist.len )
      {
         fprintf(stderr,"** error: modifying %d fields with %d values\n",
                 opts->flist.len, opts->vlist.len);
         return 1;
      }
   }

   /* verify the number of files given for each of 4 action types */

   /* -diff_... : require nfiles == 2 */
   if( opts->diff_hdr || opts->diff_nim )
   {
     if( opts->infiles.len != 2 )
     {
      fprintf(stderr,"** '-diff_XXX' options require exactly 2 inputs files\n");
      return 1;
     }
   }
   /* if we are making changes, but not overwriting... */
   else if( (opts->elist.len > 0 || opts->mod_hdr || opts->mod_nim ||
             opts->swap_hdr || opts->swap_ana || opts->swap_old ) &&
            !opts->overwrite )
   {
      if( opts->infiles.len > 1 )
      {
         fprintf(stderr,"** without -overwrite, only one input file may be"
                          " modified at a time\n");
         errs++;
      }
      else if( ! opts->prefix )
      {
         fprintf(stderr,"** missing -prefix for output file\n");
         errs++;
      }
   }

   if( opts->dci_lines && ! opts->dts && ! opts->dci )
   {
      fprintf(stderr,"** option '-dci_lines' must only be used with '-dts'\n");
      errs++;
   }

   if( opts->infiles.len <= 0 ) /* in any case */
   {
      fprintf(stderr,"** missing input files (see -infiles option)\n");
      errs++;
   }

   if ( opts->overwrite && opts->prefix )
   {
      fprintf(stderr, "** please specify only one of -prefix and -overwrite\n");
      errs++;
   }

   if( errs ) return 1;

   if( g_debug > 1 ) fprintf(stderr,"+d options seem valid\n");

   return 0;
}